

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitAtomicRMW(FunctionValidator *this,AtomicRMW *curr)

{
  bool result;
  Module *pMVar1;
  Memory *pMVar2;
  Memory *memory;
  AtomicRMW *curr_local;
  FunctionValidator *this_local;
  
  pMVar1 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  pMVar2 = Module::getMemoryOrNull(pMVar1,(Name)(curr->memory).super_IString.str);
  shouldBeTrue<wasm::AtomicRMW*>
            (this,pMVar2 != (Memory *)0x0,curr,"memory.atomicRMW memory must exist");
  pMVar1 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  result = FeatureSet::hasAtomics(&pMVar1->features);
  shouldBeTrue<wasm::AtomicRMW*>
            (this,result,curr,"Atomic operations require threads [--enable-threads]");
  validateMemBytes(this,curr->bytes,
                   (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression
                         .type.id,(Expression *)curr);
  shouldBeEqualOrFirstIsUnreachable<wasm::AtomicRMW*,wasm::Type>
            (this,(Type)(curr->ptr->type).id,(Type)(pMVar2->addressType).id,curr,
             "AtomicRMW pointer type must match memory index type");
  shouldBeEqualOrFirstIsUnreachable<wasm::AtomicRMW*,wasm::Type>
            (this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.
                        type.id,(Type)(curr->value->type).id,curr,
             "AtomicRMW result type must match operand");
  shouldBeIntOrUnreachable
            (this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.
                        type.id,(Expression *)curr,"Atomic operations are only valid on int types");
  return;
}

Assistant:

void FunctionValidator::visitAtomicRMW(AtomicRMW* curr) {
  auto* memory = getModule()->getMemoryOrNull(curr->memory);
  shouldBeTrue(!!memory, curr, "memory.atomicRMW memory must exist");
  shouldBeTrue(getModule()->features.hasAtomics(),
               curr,
               "Atomic operations require threads [--enable-threads]");
  validateMemBytes(curr->bytes, curr->type, curr);
  shouldBeEqualOrFirstIsUnreachable(
    curr->ptr->type,
    memory->addressType,
    curr,
    "AtomicRMW pointer type must match memory index type");
  shouldBeEqualOrFirstIsUnreachable(curr->type,
                                    curr->value->type,
                                    curr,
                                    "AtomicRMW result type must match operand");
  shouldBeIntOrUnreachable(
    curr->type, curr, "Atomic operations are only valid on int types");
}